

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitted_normal_matrix.cc
# Opt level: O3

void __thiscall
ipx::SplittedNormalMatrix::Prepare(SplittedNormalMatrix *this,Basis *basis,double *colscale)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  iterator __position;
  double *pdVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  vector<int,_std::allocator<int>_> nonbasic_vars;
  vector<int,_std::allocator<int>_> local_f8;
  SparseMatrix local_d8;
  vector<int,_std::allocator<int>_> *local_50;
  SparseMatrix *local_48;
  Model *local_40;
  double *local_38;
  
  local_40 = this->model_;
  uVar2 = local_40->num_rows_;
  iVar12 = local_40->num_cols_;
  this->prepared_ = false;
  local_48 = &this->N_;
  local_38 = colscale;
  SparseMatrix::clear(local_48);
  Basis::GetLuFactors(basis,&this->L_,&this->U_,
                      (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->colperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  local_50 = &this->rowperm_inv_;
  InversePerm((vector<int,_std::allocator<int>_> *)&local_d8,&this->rowperm_inv_);
  piVar6 = (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_d8._0_8_;
  (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
  (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8._0_8_ = (pointer)0x0;
  local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if ((piVar6 != (pointer)0x0) && (operator_delete(piVar6), (pointer)local_d8._0_8_ != (pointer)0x0)
     ) {
    operator_delete((void *)local_d8._0_8_);
  }
  pdVar11 = local_38;
  if (0 < (int)uVar2) {
    piVar6 = (this->colperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar13 = basis->model_->num_rows_;
    piVar8 = (basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->U_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->U_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar16 = 0;
    do {
      iVar3 = piVar7[piVar6[uVar16]];
      iVar4 = piVar8[iVar3];
      if ((-1 < iVar4) && (iVar4 < iVar13)) {
        iVar4 = piVar9[uVar16];
        lVar17 = (long)iVar4;
        iVar5 = piVar9[uVar16 + 1];
        if (iVar4 < iVar5) {
          dVar1 = local_38[iVar3];
          do {
            pdVar10[lVar17] = pdVar10[lVar17] * dVar1;
            lVar17 = lVar17 + 1;
          } while (iVar5 != lVar17);
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar2);
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
  iVar13 = iVar12 + uVar2;
  if (iVar13 != 0 && SCARRY4(iVar12,uVar2) == iVar13 < 0) {
    iVar12 = 0;
    do {
      if ((basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar12] == -1) {
        if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_f8,
                     (iterator)
                     local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_d8.nrow_);
        }
        else {
          *local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar12;
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      iVar12 = local_d8.nrow_ + 1;
      local_d8.nrow_ = iVar12;
    } while (iVar12 < iVar13);
  }
  CopyColumns(&local_d8,&local_40->AI_,&local_f8);
  (this->N_).nrow_ = local_d8.nrow_;
  piVar6 = (this->N_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->N_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->N_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->N_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar6 != (pointer)0x0) {
    operator_delete(piVar6);
  }
  piVar6 = (this->N_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->N_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_d8.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->N_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_d8.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->N_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_d8.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d8.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar6 != (pointer)0x0) {
    operator_delete(piVar6);
  }
  pdVar10 = (this->N_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->N_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d8.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->N_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d8.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->N_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d8.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d8.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar10 != (pointer)0x0) {
    operator_delete(pdVar10);
  }
  piVar6 = (this->N_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->N_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d8.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->N_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d8.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->N_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d8.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d8.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar6 != (pointer)0x0) {
    operator_delete(piVar6);
  }
  pdVar10 = (this->N_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->N_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d8.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->N_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d8.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->N_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d8.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d8.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pdVar10 != (pointer)0x0) &&
     (operator_delete(pdVar10),
     local_d8.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_d8.values_queue_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_d8.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_d8.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  PermuteRows(local_48,local_50);
  if ((long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    lVar17 = (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    piVar6 = (this->N_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->N_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar14 = 0;
    do {
      iVar12 = piVar6[(int)lVar14];
      lVar15 = (long)iVar12;
      iVar13 = piVar6[(long)(int)lVar14 + 1];
      if (iVar12 < iVar13) {
        dVar1 = pdVar11[local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar14]];
        do {
          pdVar10[lVar15] = pdVar10[lVar15] * dVar1;
          lVar15 = lVar15 + 1;
        } while (iVar13 != lVar15);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar17 + (ulong)(lVar17 == 0));
  }
  piVar6 = (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar6) {
    (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar6;
  }
  local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
  if (0 < (int)uVar2) {
    iVar12 = 0;
    do {
      iVar13 = (basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(this->colperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar12]]];
      if ((-1 < iVar13) && (basis->model_->num_rows_ <= iVar13)) {
        __position._M_current =
             (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->free_positions_,__position,
                     &local_d8.nrow_);
        }
        else {
          *__position._M_current = iVar12;
          (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      iVar12 = local_d8.nrow_ + 1;
      local_d8.nrow_ = iVar12;
    } while (iVar12 < (int)uVar2);
  }
  this->prepared_ = true;
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SplittedNormalMatrix::Prepare(const Basis& basis, const double* colscale) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    assert(colscale);
    prepared_ = false;
    N_.clear();                 // deallocate old memory

    basis.GetLuFactors(&L_, &U_, rowperm_inv_.data(), colperm_.data());
    rowperm_inv_ = InversePerm(rowperm_inv_);

    // Scale columns of U.
    for (Int k = 0; k < m; k++) {
        Int p = colperm_[k];
        Int j = basis[p];
        // Nothing to do for BASIC_FREE variables.
        if (basis.StatusOf(j) == Basis::BASIC) {
            double d = colscale[j];
            assert(std::isfinite(d) && d > 0.0);
            ScaleColumn(U_, k, d);
        }
    }

    // Build N with permuted row indices.
    std::vector<Int> nonbasic_vars;
    for (Int j = 0; j < n+m; j++)
        if (basis.StatusOf(j) == Basis::NONBASIC)
            nonbasic_vars.push_back(j);
    N_ = CopyColumns(AI, nonbasic_vars);
    PermuteRows(N_, rowperm_inv_);

    // Scale columns of N.
    for (size_t k = 0; k < nonbasic_vars.size(); k++) {
        Int j = nonbasic_vars[k];
        double d = colscale[j];
        assert(std::isfinite(d));
        ScaleColumn(N_, (Int)k, d);
    }

    // Build list of free variables.
    free_positions_.clear();
    for (Int k = 0; k < m; k++) {
        Int p = colperm_[k];
        Int j = basis[p];
        if (basis.StatusOf(j) == Basis::BASIC_FREE)
            free_positions_.push_back(k);
    }
    prepared_ = true;
}